

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand_rolled_vtable.hpp
# Opt level: O2

printable_vtable * __thiscall printable_vtable::operator=(printable_vtable *this)

{
  printable_vtable temp;
  printable_vtable local_38;
  
  local_38.vtable_._M_elems[2] = print_wrapper<hi_printable>::exec;
  local_38.vtable_._M_elems[0] = clone_impl<hi_printable>;
  local_38.vtable_._M_elems[1] = delete_impl<hi_printable>;
  local_38.get_value_ptr_ = get_value_ptr<false>;
  local_38.value_ = (void *)0x0;
  std::swap<printable_vtable>(&local_38,this);
  ~printable_vtable(&local_38);
  return this;
}

Assistant:

printable_vtable & operator= (T value)
    {
        printable_vtable temp(std::move(value));
        std::swap(temp, *this);
        return *this;
    }